

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void jpeg_gen_optimal_table(j_compress_ptr cinfo,JHUFF_TBL *htbl,long *freq)

{
  UINT8 *pUVar1;
  char *pcVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  UINT8 *pUVar10;
  ulong uVar11;
  long lVar12;
  UINT8 *pUVar13;
  ulong uVar14;
  UINT8 bits [33];
  int codesize [257];
  int others [257];
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  UINT8 local_858 [32];
  int local_838 [260];
  uint local_428 [258];
  
  local_868 = 0;
  uStack_860 = 0;
  local_858[0] = '\0';
  local_858[1] = '\0';
  local_858[2] = '\0';
  local_858[3] = '\0';
  local_858[4] = '\0';
  local_858[5] = '\0';
  local_858[6] = '\0';
  local_858[7] = '\0';
  local_858[8] = '\0';
  local_858[9] = '\0';
  local_858[10] = '\0';
  local_858[0xb] = '\0';
  local_858[0xc] = '\0';
  local_858[0xd] = '\0';
  local_858[0xe] = '\0';
  local_858[0xf] = '\0';
  local_858[0x10] = 0;
  uVar14 = 0;
  uStack_870 = 0x116c59;
  memset(local_838,0,0x404);
  uStack_870 = 0x116c70;
  memset(local_428,0xff,0x404);
  freq[0x100] = 1;
  uVar6 = 0xffffffff;
  lVar8 = 1000000000;
  while( true ) {
    do {
      lVar12 = freq[uVar14];
      if (lVar12 <= lVar8 && lVar12 != 0) {
        uVar6 = uVar14 & 0xffffffff;
        lVar8 = lVar12;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x101);
    uVar14 = 0xffffffff;
    lVar8 = 1000000000;
    uVar11 = 0;
    do {
      lVar12 = freq[uVar11];
      if ((uVar6 != uVar11 && lVar12 != 0) && lVar12 <= lVar8) {
        uVar14 = uVar11 & 0xffffffff;
        lVar8 = lVar12;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x101);
    if ((int)(uint)uVar14 < 0) break;
    freq[(int)uVar6] = freq[(int)uVar6] + freq[uVar14];
    freq[uVar14] = 0;
    uVar6 = (long)(int)uVar6;
    do {
      uVar11 = uVar6;
      local_838[uVar11] = local_838[uVar11] + 1;
      uVar6 = (ulong)local_428[uVar11];
    } while (-1 < (int)local_428[uVar11]);
    local_428[uVar11] = (uint)uVar14;
    local_838[uVar14] = local_838[uVar14] + 1;
    uVar9 = local_428[uVar14];
    uVar6 = 0xffffffff;
    lVar8 = 1000000000;
    uVar14 = 0;
    if (-1 < (int)uVar9) {
      do {
        local_838[uVar9] = local_838[uVar9] + 1;
        uVar9 = local_428[uVar9];
      } while (-1 < (int)uVar9);
      uVar14 = 0;
    }
  }
  lVar8 = 0;
  do {
    iVar5 = local_838[lVar8];
    if ((long)iVar5 != 0) {
      if (0x20 < iVar5) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x28;
        uStack_870 = 0x116d7e;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
      pcVar2 = (char *)((long)&local_868 + (long)iVar5);
      *pcVar2 = *pcVar2 + '\x01';
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x101);
  lVar8 = 0x2000000000;
  pUVar10 = local_858 + 0xf;
  uVar6 = 0x20;
  do {
    while( true ) {
      lVar12 = lVar8;
      pUVar13 = pUVar10;
      if (*(char *)((long)&local_868 + uVar6) == '\0') break;
      do {
        lVar12 = lVar12 + -0x100000000;
        pUVar1 = pUVar13 + -1;
        pUVar13 = pUVar13 + -1;
      } while (*pUVar1 == '\0');
      *(char *)((long)&local_868 + uVar6) = *(char *)((long)&local_868 + uVar6) + -2;
      pcVar2 = (char *)((long)&uStack_870 + uVar6 + 7);
      *pcVar2 = *pcVar2 + '\x01';
      pcVar2 = (char *)((long)&local_868 + (lVar12 >> 0x20));
      *pcVar2 = *pcVar2 + '\x02';
      *pUVar13 = *pUVar13 + 0xff;
    }
    lVar8 = lVar8 + -0x100000000;
    pUVar10 = pUVar10 + -1;
    bVar4 = 0x11 < uVar6;
    uVar6 = uVar6 - 1;
  } while (bVar4);
  pUVar10 = local_858 + 1;
  do {
    pUVar13 = pUVar10 + -1;
    pUVar10 = pUVar10 + -1;
  } while (*pUVar13 == '\0');
  *pUVar10 = *pUVar13 + 0xff;
  htbl->bits[0x10] = local_858[0];
  *(undefined8 *)htbl->bits = local_868;
  *(undefined8 *)(htbl->bits + 8) = uStack_860;
  iVar5 = 0;
  iVar7 = 1;
  do {
    lVar8 = 0;
    do {
      if (local_838[lVar8] == iVar7) {
        htbl->huffval[iVar5] = (UINT8)lVar8;
        iVar5 = iVar5 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x21);
  htbl->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
jpeg_gen_optimal_table (j_compress_ptr cinfo, JHUFF_TBL * htbl, long freq[])
{
#define MAX_CLEN 32		/* assumed maximum initial code length */
  UINT8 bits[MAX_CLEN+1];	/* bits[k] = # of symbols with code length k */
  int codesize[257];		/* codesize[k] = code length of symbol k */
  int others[257];		/* next symbol in current branch of tree */
  int c1, c2;
  int p, i, j;
  long v;

  /* This algorithm is explained in section K.2 of the JPEG standard */

  MEMZERO(bits, SIZEOF(bits));
  MEMZERO(codesize, SIZEOF(codesize));
  for (i = 0; i < 257; i++)
    others[i] = -1;		/* init links to empty */
  
  freq[256] = 1;		/* make sure 256 has a nonzero count */
  /* Including the pseudo-symbol 256 in the Huffman procedure guarantees
   * that no real symbol is given code-value of all ones, because 256
   * will be placed last in the largest codeword category.
   */

  /* Huffman's basic algorithm to assign optimal code lengths to symbols */

  for (;;) {
    /* Find the smallest nonzero frequency, set c1 = its symbol */
    /* In case of ties, take the larger symbol number */
    c1 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v) {
	v = freq[i];
	c1 = i;
      }
    }

    /* Find the next smallest nonzero frequency, set c2 = its symbol */
    /* In case of ties, take the larger symbol number */
    c2 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v && i != c1) {
	v = freq[i];
	c2 = i;
      }
    }

    /* Done if we've merged everything into one frequency */
    if (c2 < 0)
      break;
    
    /* Else merge the two counts/trees */
    freq[c1] += freq[c2];
    freq[c2] = 0;

    /* Increment the codesize of everything in c1's tree branch */
    codesize[c1]++;
    while (others[c1] >= 0) {
      c1 = others[c1];
      codesize[c1]++;
    }
    
    others[c1] = c2;		/* chain c2 onto c1's tree branch */
    
    /* Increment the codesize of everything in c2's tree branch */
    codesize[c2]++;
    while (others[c2] >= 0) {
      c2 = others[c2];
      codesize[c2]++;
    }
  }

  /* Now count the number of symbols of each code length */
  for (i = 0; i <= 256; i++) {
    if (codesize[i]) {
      /* The JPEG standard seems to think that this can't happen, */
      /* but I'm paranoid... */
      if (codesize[i] > MAX_CLEN)
	ERREXIT(cinfo, JERR_HUFF_CLEN_OVERFLOW);

      bits[codesize[i]]++;
    }
  }

  /* JPEG doesn't allow symbols with code lengths over 16 bits, so if the pure
   * Huffman procedure assigned any such lengths, we must adjust the coding.
   * Here is what the JPEG spec says about how this next bit works:
   * Since symbols are paired for the longest Huffman code, the symbols are
   * removed from this length category two at a time.  The prefix for the pair
   * (which is one bit shorter) is allocated to one of the pair; then,
   * skipping the BITS entry for that prefix length, a code word from the next
   * shortest nonzero BITS entry is converted into a prefix for two code words
   * one bit longer.
   */
  
  for (i = MAX_CLEN; i > 16; i--) {
    while (bits[i] > 0) {
      j = i - 2;		/* find length of new prefix to be used */
      while (bits[j] == 0)
	j--;
      
      bits[i] -= 2;		/* remove two symbols */
      bits[i-1]++;		/* one goes in this length */
      bits[j+1] += 2;		/* two new symbols in this length */
      bits[j]--;		/* symbol of this length is now a prefix */
    }
  }

  /* Remove the count for the pseudo-symbol 256 from the largest codelength */
  while (bits[i] == 0)		/* find largest codelength still in use */
    i--;
  bits[i]--;
  
  /* Return final symbol counts (only for lengths 0..16) */
  MEMCOPY(htbl->bits, bits, SIZEOF(htbl->bits));
  
  /* Return a list of the symbols sorted by code length */
  /* It's not real clear to me why we don't need to consider the codelength
   * changes made above, but the JPEG spec seems to think this works.
   */
  p = 0;
  for (i = 1; i <= MAX_CLEN; i++) {
    for (j = 0; j <= 255; j++) {
      if (codesize[j] == i) {
	htbl->huffval[p] = (UINT8) j;
	p++;
      }
    }
  }

  /* Set sent_table FALSE so updated table will be written to JPEG file. */
  htbl->sent_table = FALSE;
}